

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

sxi32 MemObjTryIntger(jx9_value *pObj)

{
  sxi64 sVar1;
  sxi64 iVal;
  jx9_value *pObj_local;
  
  sVar1 = MemObjRealToInt(pObj);
  if (((((pObj->x).rVal == (double)sVar1) && (!NAN((pObj->x).rVal) && !NAN((double)sVar1))) &&
      (-0x8000000000000000 < sVar1)) && (sVar1 < 0x7fffffffffffffff)) {
    (pObj->x).iVal = sVar1;
    pObj->iFlags = 2;
  }
  return 0;
}

Assistant:

static sxi32 MemObjTryIntger(jx9_value *pObj)
{
	sxi64 iVal = MemObjRealToInt(&(*pObj));
  /* Only mark the value as an integer if
  **
  **    (1) the round-trip conversion real->int->real is a no-op, and
  **    (2) The integer is neither the largest nor the smallest
  **        possible integer
  **
  ** The second and third terms in the following conditional enforces
  ** the second condition under the assumption that addition overflow causes
  ** values to wrap around.  On x86 hardware, the third term is always
  ** true and could be omitted.  But we leave it in because other
  ** architectures might behave differently.
  */
	if( pObj->x.rVal ==(jx9_real)iVal && iVal>SMALLEST_INT64 && iVal<LARGEST_INT64 ){
		pObj->x.iVal = iVal; 
		pObj->iFlags = MEMOBJ_INT;
	}
	return SXRET_OK;
}